

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.cpp
# Opt level: O2

int __thiscall de::Socket::listen(Socket *this,int __fd,int __n)

{
  SocketError *this_00;
  deBool dVar1;
  undefined4 in_register_00000034;
  allocator<char> local_39;
  string local_38;
  
  dVar1 = deSocket_listen(this->m_socket,*(deSocketAddress **)CONCAT44(in_register_00000034,__fd));
  if (dVar1 != 0) {
    return dVar1;
  }
  this_00 = (SocketError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Listening on socket failed",&local_39);
  SocketError::SocketError(this_00,&local_38);
  __cxa_throw(this_00,&SocketError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Socket::listen (const SocketAddress& address)
{
	if (!deSocket_listen(m_socket, address))
		throw SocketError("Listening on socket failed");
}